

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

STArray * __thiscall jbcoin::STObject::getFieldArray(STObject *this,SField *field)

{
  int iVar1;
  STArray *pSVar2;
  
  if (getFieldArray(jbcoin::SField_const&)::empty == '\0') {
    iVar1 = __cxa_guard_acquire(&getFieldArray(jbcoin::SField_const&)::empty);
    if (iVar1 != 0) {
      STArray::STArray(&getFieldArray::empty);
      __cxa_atexit(STArray::~STArray,&getFieldArray::empty,&__dso_handle);
      __cxa_guard_release(&getFieldArray(jbcoin::SField_const&)::empty);
    }
  }
  pSVar2 = getFieldByConstRef<jbcoin::STArray,jbcoin::STArray>(this,field,&getFieldArray::empty);
  return pSVar2;
}

Assistant:

const STArray& STObject::getFieldArray (SField const& field) const
{
    static STArray const empty{};
    return getFieldByConstRef <STArray> (field, empty);
}